

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

uint32_t __thiscall libtorrent::aux::torrent::tracker_key(torrent *this)

{
  bool bVar1;
  uint32_t uVar2;
  hasher *phVar3;
  uint local_6c;
  uint8_t *local_60;
  uchar *ptr;
  hasher local_48;
  undefined1 local_3c [8];
  sha1_hash h;
  session_interface *psStack_20;
  uint32_t storage;
  uintptr_t ses;
  uintptr_t self;
  torrent *this_local;
  
  psStack_20 = (this->super_torrent_hot_members).m_ses;
  ses = (uintptr_t)this;
  self = (uintptr_t)this;
  bVar1 = storage_holder::operator_cast_to_bool(&this->m_storage);
  if (bVar1) {
    h.m_number._M_elems[3] = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage)
    ;
    local_6c = strong_typedef::operator_cast_to_unsigned_int
                         ((strong_typedef *)(h.m_number._M_elems + 3));
  }
  else {
    local_6c = 0;
  }
  h.m_number._M_elems[4] = local_6c;
  lcrypto::hasher::hasher(&local_48,(char *)&ses,8);
  phVar3 = lcrypto::hasher::update(&local_48,(char *)(h.m_number._M_elems + 4),4);
  phVar3 = lcrypto::hasher::update(phVar3,(char *)&stack0xffffffffffffffe0,8);
  lcrypto::hasher::final((sha1_hash *)local_3c,phVar3);
  lcrypto::hasher::~hasher(&local_48);
  local_60 = digest32<160L>::operator[]((digest32<160L> *)local_3c,0);
  uVar2 = read_uint32<unsigned_char_const*>(&local_60);
  return uVar2;
}

Assistant:

std::uint32_t torrent::tracker_key() const
	{
		auto const self = reinterpret_cast<uintptr_t>(this);
		auto const ses = reinterpret_cast<uintptr_t>(&m_ses);
		std::uint32_t const storage = m_storage
			? static_cast<std::uint32_t>(static_cast<storage_index_t>(m_storage))
			: 0;
		sha1_hash const h = hasher(reinterpret_cast<char const*>(&self), sizeof(self))
			.update(reinterpret_cast<char const*>(&storage), sizeof(storage))
			.update(reinterpret_cast<char const*>(&ses), sizeof(ses))
			.final();
		unsigned char const* ptr = &h[0];
		return aux::read_uint32(ptr);
	}